

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPreviewImage.cpp
# Opt level: O0

PreviewImage * __thiscall Imf_3_3::PreviewImage::operator=(PreviewImage *this,PreviewImage *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  PreviewRgba *pPVar4;
  PreviewImage *in_RSI;
  PreviewImage *in_RDI;
  uint i;
  PreviewRgba *local_50;
  uint local_20;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->_pixels != (PreviewRgba *)0x0) {
      operator_delete__(in_RDI->_pixels);
    }
    in_RDI->_width = in_RSI->_width;
    in_RDI->_height = in_RSI->_height;
    uVar2 = CONCAT44(0,in_RSI->_width * in_RSI->_height);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pPVar4 = (PreviewRgba *)operator_new__(uVar3);
    if (uVar2 != 0) {
      local_50 = pPVar4;
      do {
        PreviewRgba::PreviewRgba(local_50,'\0','\0','\0',0xff);
        local_50 = local_50 + 1;
      } while (local_50 != pPVar4 + uVar2);
    }
    in_RDI->_pixels = pPVar4;
    for (local_20 = 0; local_20 < in_RDI->_width * in_RDI->_height; local_20 = local_20 + 1) {
      in_RDI->_pixels[local_20] = in_RSI->_pixels[local_20];
    }
  }
  return in_RDI;
}

Assistant:

PreviewImage&
PreviewImage::operator= (const PreviewImage& other)
{
    if (this != &other)
    {
        delete[] _pixels;

        _width  = other._width;
        _height = other._height;
        _pixels = new PreviewRgba[other._width * other._height];

        for (unsigned int i = 0; i < _width * _height; ++i)
            _pixels[i] = other._pixels[i];
    }

    return *this;
}